

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

Sfm_Lib_t * Sfm_LibStart(int nVars,int fDelay,int fVerbose)

{
  int iVar1;
  Sfm_Lib_t *pSVar2;
  Vec_Mem_t *pVVar3;
  Sfm_Fun_t *pSVar4;
  Sfm_Lib_t *p;
  int fVerbose_local;
  int fDelay_local;
  int nVars_local;
  
  pSVar2 = (Sfm_Lib_t *)calloc(1,0xa0);
  if (8 < nVars) {
    __assert_fail("nVars <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0xcf,"Sfm_Lib_t *Sfm_LibStart(int, int, int)");
  }
  pVVar3 = Vec_MemAllocForTT(nVars,0);
  pSVar2->vTtMem = pVVar3;
  Vec_IntGrow(&pSVar2->vLists,0x10000);
  Vec_IntGrow(&pSVar2->vCounts,0x10000);
  Vec_IntGrow(&pSVar2->vHits,0x10000);
  Vec_IntFill(&pSVar2->vLists,2,-1);
  Vec_IntFill(&pSVar2->vCounts,2,-1);
  Vec_IntFill(&pSVar2->vHits,2,-1);
  pSVar2->nObjsAlloc = 0x10000;
  pSVar4 = (Sfm_Fun_t *)calloc((long)pSVar2->nObjsAlloc,0x1c);
  pSVar2->pObjs = pSVar4;
  pSVar2->fDelay = fDelay;
  if (fDelay != 0) {
    Vec_IntGrow(&pSVar2->vProfs,0x10000);
    Vec_IntGrow(&pSVar2->vStore,0x40000);
  }
  Vec_IntGrow(&pSVar2->vTemp,0x10);
  pSVar2->nVars = nVars;
  iVar1 = Abc_TtWordNum(nVars);
  pSVar2->nWords = iVar1;
  pSVar2->fVerbose = fVerbose;
  return pSVar2;
}

Assistant:

Sfm_Lib_t * Sfm_LibStart( int nVars, int fDelay, int fVerbose )
{
    Sfm_Lib_t * p = ABC_CALLOC( Sfm_Lib_t, 1 );
    assert( nVars <= SFM_SUPP_MAX );
    p->vTtMem = Vec_MemAllocForTT( nVars, 0 );   
    Vec_IntGrow( &p->vLists,  (1 << 16) );
    Vec_IntGrow( &p->vCounts, (1 << 16) );
    Vec_IntGrow( &p->vHits,   (1 << 16) );
    Vec_IntFill( &p->vLists,  2, -1 );
    Vec_IntFill( &p->vCounts, 2, -1 );
    Vec_IntFill( &p->vHits,   2, -1 );
    p->nObjsAlloc = (1 << 16);
    p->pObjs = ABC_CALLOC( Sfm_Fun_t, p->nObjsAlloc );
    p->fDelay = fDelay;
    if ( fDelay ) Vec_IntGrow( &p->vProfs,  (1 << 16) );
    if ( fDelay ) Vec_IntGrow( &p->vStore,  (1 << 18) );
    Vec_IntGrow( &p->vTemp, 16 );
    p->nVars = nVars;
    p->nWords = Abc_TtWordNum( nVars );
    p->fVerbose = fVerbose;
    return p;
}